

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  ImGuiContext *pIVar1;
  ImGuiWindowSettings *local_28;
  ImGuiWindowSettings *settings;
  ImGuiContext *g;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  local_28 = ImChunkStream<ImGuiWindowSettings>::begin(&GImGui->SettingsWindows);
  while( true ) {
    if (local_28 == (ImGuiWindowSettings *)0x0) {
      return (ImGuiWindowSettings *)0x0;
    }
    if (local_28->ID == id) break;
    local_28 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&pIVar1->SettingsWindows,local_28);
  }
  return local_28;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}